

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O0

int64_t bson_iter_as_int64(bson_iter_t *iter)

{
  _Bool _Var1;
  int32_t iVar2;
  double dVar3;
  bson_iter_t *iter_local;
  
  if (iter != (bson_iter_t *)0x0) {
    switch(iter->raw[iter->type]) {
    case '\x01':
      dVar3 = bson_iter_double(iter);
      iter_local = (bson_iter_t *)(long)dVar3;
      break;
    default:
      iter_local = (bson_iter_t *)0x0;
      break;
    case '\b':
      _Var1 = bson_iter_bool(iter);
      iter_local = (bson_iter_t *)(ulong)_Var1;
      break;
    case '\x10':
      iVar2 = bson_iter_int32(iter);
      iter_local = (bson_iter_t *)(long)iVar2;
      break;
    case '\x12':
      iter_local = (bson_iter_t *)bson_iter_int64(iter);
    }
    return (int64_t)iter_local;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
          ,0x466,"bson_iter_as_int64","iter");
  abort();
}

Assistant:

int64_t
bson_iter_as_int64 (const bson_iter_t *iter) /* IN */
{
   BSON_ASSERT (iter);

   switch ((int) ITER_TYPE (iter)) {
   case BSON_TYPE_BOOL:
      return (int64_t) bson_iter_bool (iter);
   case BSON_TYPE_DOUBLE:
      return (int64_t) bson_iter_double (iter);
   case BSON_TYPE_INT64:
      return bson_iter_int64 (iter);
   case BSON_TYPE_INT32:
      return (int64_t) bson_iter_int32 (iter);
   default:
      return 0;
   }
}